

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall gmlc::networking::TcpServer::initialConnect(TcpServer *this)

{
  _Manager_type p_Var1;
  target_fns *ptVar2;
  object_fns *poVar3;
  pointer pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *extraout_RDX_07;
  sockaddr *extraout_RDX_08;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  shared_ptr<gmlc::networking::TcpAcceptor> *in_RSI;
  undefined8 uVar17;
  target_fns *ptVar18;
  undefined8 uVar19;
  pointer psVar20;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar21;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar22;
  uint __uval;
  uint uVar23;
  pointer ep;
  pointer psVar24;
  pointer acc;
  string __str_1;
  string __str;
  string __str_2;
  undefined1 local_170 [16];
  undefined1 local_160 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [32];
  _Any_data local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Any_data local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  uint local_98;
  undefined4 uStack_94;
  target_fns *local_90 [2];
  pointer local_80;
  undefined1 local_78 [24];
  code *pcStack_60;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  if (((this->halted)._M_base._M_i & 1U) == 0) {
    ep = (this->endpoints).
         super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->endpoints).
             super__Vector_base<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_160._16_8_ = this;
    if (ep != pbVar4) {
      in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&this->logFunction;
      local_a8._0_8_ = in_RCX;
      do {
        uVar19 = local_160._16_8_;
        TcpAcceptor::create((TcpAcceptor *)local_170,*(io_context **)(local_160._16_8_ + 0x10),ep);
        if (*(bool *)(uVar19 + 0xf1) == true) {
          local_148._M_dataplus._M_p._0_4_ = 1;
          asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
          set_option<asio::detail::socket_option::boolean<1,2>>
                    ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)
                     (local_170._0_8_ + 0x30),(boolean<1,_2> *)&local_148);
        }
        else {
          local_148._M_dataplus._M_p = (pointer)((ulong)local_148._M_dataplus._M_p._4_4_ << 0x20);
          asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
          set_option<asio::detail::socket_option::boolean<1,2>>
                    ((basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *)
                     (local_170._0_8_ + 0x30),(boolean<1,_2> *)&local_148);
        }
        local_78._8_8_ = 0;
        local_78._0_8_ = local_160._16_8_;
        pcStack_60 = std::
                     _Function_handler<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpServer.cpp:159:13)>
                     ::_M_invoke;
        local_78._16_8_ =
             std::
             _Function_handler<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpServer.cpp:159:13)>
             ::_M_manager;
        std::
        function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
        ::operator=((function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                     *)(local_170._0_8_ + 0x88),
                    (function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                     *)local_78);
        if ((_Manager_type)local_78._16_8_ != (_Manager_type)0x0) {
          (*(code *)local_78._16_8_)
                    ((function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                      *)local_78,
                     (function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                      *)local_78,3);
        }
        uVar19 = local_170._0_8_;
        if (*(_Manager_type *)(local_160._16_8_ + 0xe0) != (_Manager_type)0x0) {
          std::
          function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function(&local_50,
                     (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_a8._0_8_);
          TcpAcceptor::setLoggingFunction((TcpAcceptor *)uVar19,&local_50);
          if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_50.super__Function_base._M_manager)(&local_50,&local_50,3);
          }
        }
        in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)local_170;
        std::
        vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>>>
        ::emplace_back<std::shared_ptr<gmlc::networking::TcpAcceptor>>
                  ((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>>>
                    *)&this->acceptors,in_RSI);
        in_RDX = extraout_RDX;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
          in_RDX = extraout_RDX_00;
        }
        ep = ep + 1;
      } while (ep != pbVar4);
    }
    psVar24 = (((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                 *)(local_160._16_8_ + 0x58))->
              super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar20 = *(pointer *)(local_160._16_8_ + 0x60);
    pfVar21 = (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x0;
    if (psVar24 == psVar20) {
      uVar15 = 0;
      pfVar22 = pfVar21;
    }
    else {
      uVar15 = 0;
      local_a8._0_8_ =
           (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            *)0x0;
      local_80 = psVar20;
      do {
        uVar23 = (uint)pfVar21 + 1;
        iVar8 = TcpAcceptor::connect
                          ((psVar24->
                           super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,(int)in_RSI,in_RDX,(socklen_t)in_RCX);
        if ((char)iVar8 == '\0') {
          local_e8._M_unused._M_object = &local_d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"unable to connect acceptor ","");
          uVar19 = local_160._16_8_;
          uVar14 = 1;
          if (8 < (uint)pfVar21) {
            uVar9 = uVar23;
            uVar7 = 4;
            do {
              uVar14 = uVar7;
              if (uVar9 < 100) {
                uVar14 = uVar14 - 2;
                goto LAB_0042dd3c;
              }
              if (uVar9 < 1000) {
                uVar14 = uVar14 - 1;
                goto LAB_0042dd3c;
              }
              if (uVar9 < 10000) goto LAB_0042dd3c;
              bVar6 = 99999 < uVar9;
              uVar9 = uVar9 / 10000;
              uVar7 = uVar14 + 4;
            } while (bVar6);
            uVar14 = uVar14 + 1;
          }
LAB_0042dd3c:
          local_c8._M_unused._M_object = &local_b8;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c8,(ulong)uVar14,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_c8._M_unused._0_8_,uVar14,uVar23);
          uVar17 = (_Manager_type)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_unused._0_8_ != &local_d8) {
            uVar17 = local_d8._M_allocated_capacity;
          }
          if ((ulong)uVar17 < (_Manager_type)(local_c8._8_8_ + local_e8._8_8_)) {
            uVar17 = (_Manager_type)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_unused._0_8_ != &local_b8) {
              uVar17 = local_b8._M_allocated_capacity;
            }
            if ((ulong)uVar17 < (_Manager_type)(local_c8._8_8_ + local_e8._8_8_)) goto LAB_0042ddd9;
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_c8,0,0,(char *)local_e8._M_unused._0_8_,local_e8._8_8_);
          }
          else {
LAB_0042ddd9:
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_e8,(char *)local_c8._M_unused._0_8_,local_c8._8_8_);
          }
          local_108._0_8_ = (pbVar10->_M_dataplus)._M_p;
          paVar11 = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._0_8_ == paVar11) {
            local_108._16_8_ = paVar11->_M_allocated_capacity;
            local_108._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            local_108._0_8_ = (object_fns *)(local_108 + 0x10);
          }
          else {
            local_108._16_8_ = paVar11->_M_allocated_capacity;
          }
          local_108._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar10->_M_string_length = 0;
          paVar11->_M_local_buf[0] = '\0';
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108," of ");
          local_148._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
          paVar11 = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p == paVar11) {
            local_148.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          }
          else {
            local_148.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_148._M_string_length = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          uVar16 = (long)*(pointer *)(uVar19 + 0x60) -
                   (long)(((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                            *)(uVar19 + 0x58))->
                         super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4;
          uVar14 = 1;
          if (9 < uVar16) {
            uVar12 = uVar16;
            uVar9 = 4;
            do {
              uVar14 = uVar9;
              if (uVar12 < 100) {
                uVar14 = uVar14 - 2;
                goto LAB_0042df06;
              }
              if (uVar12 < 1000) {
                uVar14 = uVar14 - 1;
                goto LAB_0042df06;
              }
              if (uVar12 < 10000) goto LAB_0042df06;
              bVar6 = 99999 < uVar12;
              uVar12 = uVar12 / 10000;
              uVar9 = uVar14 + 4;
            } while (bVar6);
            uVar14 = uVar14 + 1;
          }
LAB_0042df06:
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_128,(ulong)uVar14,'\0');
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar16);
          psVar20 = local_80;
          uVar17 = (_Manager_type)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            uVar17 = local_148.field_2._M_allocated_capacity;
          }
          p_Var1 = (_Manager_type)
                   ((long)&(((execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::tcp>_>
                              *)local_148._M_string_length)->super_service)._vptr_service +
                   CONCAT44(local_128._M_string_length._4_4_,(uint)local_128._M_string_length));
          if ((ulong)uVar17 < p_Var1) {
            uVar17 = (_Manager_type)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              uVar17 = local_128.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < p_Var1) goto LAB_0042df81;
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_128,0,0,local_148._M_dataplus._M_p,
                                 local_148._M_string_length);
          }
          else {
LAB_0042df81:
            pbVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_148,local_128._M_dataplus._M_p,
                                 CONCAT44(local_128._M_string_length._4_4_,
                                          (uint)local_128._M_string_length));
          }
          local_170._0_8_ = (pbVar10->_M_dataplus)._M_p;
          in_RCX = &pbVar10->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._0_8_ == in_RCX) {
            local_160._0_8_ = in_RCX->_M_allocated_capacity;
            local_160._8_8_ = *(uchar (*) [8])((long)&pbVar10->field_2 + 8);
            local_170._0_8_ = (TcpAcceptor *)(local_170 + 0x10);
          }
          else {
            local_160._0_8_ = in_RCX->_M_allocated_capacity;
          }
          local_170._8_8_ = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)in_RCX;
          pbVar10->_M_string_length = 0;
          in_RCX->_M_local_buf[0] = '\0';
          in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)0x0;
          logger((TcpServer *)uVar19,0,(string *)local_170);
          in_RDX = extraout_RDX_02;
          if ((TcpAcceptor *)local_170._0_8_ != (TcpAcceptor *)(local_170 + 0x10)) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)(local_160._0_8_ + 1);
            operator_delete((void *)local_170._0_8_,(ulong)in_RSI);
            in_RDX = extraout_RDX_03;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                     (local_128.field_2._M_allocated_capacity + 1);
            operator_delete(local_128._M_dataplus._M_p,(ulong)in_RSI);
            in_RDX = extraout_RDX_04;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                     (local_148.field_2._M_allocated_capacity + 1);
            operator_delete(local_148._M_dataplus._M_p,(ulong)in_RSI);
            in_RDX = extraout_RDX_05;
          }
          if ((object_fns *)local_108._0_8_ != (object_fns *)(local_108 + 0x10)) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)(local_108._16_8_ + 1);
            operator_delete((void *)local_108._0_8_,(ulong)in_RSI);
            in_RDX = extraout_RDX_06;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_unused._0_8_ != &local_b8) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                     (local_b8._M_allocated_capacity + 1);
            operator_delete(local_c8._M_unused._M_object,(ulong)in_RSI);
            in_RDX = extraout_RDX_07;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_unused._0_8_ != &local_d8) {
            in_RSI = (shared_ptr<gmlc::networking::TcpAcceptor> *)
                     (local_d8._M_allocated_capacity + 1);
            operator_delete(local_e8._M_unused._M_object,(ulong)in_RSI);
            in_RDX = extraout_RDX_08;
          }
        }
        else {
          uVar15 = uVar15 + 1;
          local_a8._0_8_ = CONCAT71((int7)(CONCAT44(extraout_var,iVar8) >> 8),1);
          in_RDX = extraout_RDX_01;
        }
        psVar24 = psVar24 + 1;
        pfVar21 = (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)(ulong)uVar23;
        pfVar22 = (function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)local_a8._0_8_;
      } while (psVar24 != psVar20);
    }
    uVar19 = local_160._16_8_;
    if (((ulong)pfVar22 & 1) != 0) {
      if ((ulong)((long)*(pointer *)(local_160._16_8_ + 0x60) -
                  (long)(((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                           *)(local_160._16_8_ + 0x58))->
                        super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar15) {
        return;
      }
      local_c8._M_unused._M_object = &local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"partial connection on the server ","");
      uVar23 = 1;
      if (9 < uVar15) {
        uVar16 = uVar15;
        uVar14 = 4;
        do {
          uVar23 = uVar14;
          if (uVar16 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_0042e1e8;
          }
          if (uVar16 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_0042e1e8;
          }
          if (uVar16 < 10000) goto LAB_0042e1e8;
          bVar6 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          uVar14 = uVar23 + 4;
        } while (bVar6);
        uVar23 = uVar23 + 1;
      }
LAB_0042e1e8:
      paVar11 = &local_128.field_2;
      local_128._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_128,(ulong)uVar23,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_128._M_dataplus._M_p,(uint)local_128._M_string_length,uVar15);
      p_Var1 = (_Manager_type)
               (CONCAT44(local_128._M_string_length._4_4_,(uint)local_128._M_string_length) +
               local_c8._8_8_);
      uVar17 = (_Manager_type)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_unused._0_8_ != &local_b8) {
        uVar17 = local_b8._M_allocated_capacity;
      }
      if ((ulong)uVar17 < p_Var1) {
        uVar17 = (_Manager_type)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar11) {
          uVar17 = local_128.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < p_Var1) goto LAB_0042e256;
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace(&local_128,0,0,(char *)local_c8._M_unused._0_8_,local_c8._8_8_);
      }
      else {
LAB_0042e256:
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_c8,local_128._M_dataplus._M_p,
                            CONCAT44(local_128._M_string_length._4_4_,
                                     (uint)local_128._M_string_length));
      }
      local_e8._M_unused._M_object = &local_d8;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar10->_M_dataplus)._M_p;
      paVar13 = &pbVar10->field_2;
      if (paVar5 == paVar13) {
        local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_d8._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_e8._M_unused._M_object = paVar5;
      }
      local_e8._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar10->_M_string_length = 0;
      paVar13->_M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_e8," of ");
      poVar3 = (object_fns *)(local_108 + 0x10);
      local_108._0_8_ = (pbVar10->_M_dataplus)._M_p;
      paVar13 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ == paVar13) {
        local_108._16_8_ = paVar13->_M_allocated_capacity;
        local_108._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_108._0_8_ = poVar3;
      }
      else {
        local_108._16_8_ = paVar13->_M_allocated_capacity;
      }
      local_108._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      uVar15 = (long)*(pointer *)(uVar19 + 0x60) -
               (long)(((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                        *)(uVar19 + 0x58))->
                     super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
      uVar23 = 1;
      if (9 < uVar15) {
        uVar16 = uVar15;
        uVar14 = 4;
        do {
          uVar23 = uVar14;
          if (uVar16 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_0042e393;
          }
          if (uVar16 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_0042e393;
          }
          if (uVar16 < 10000) goto LAB_0042e393;
          bVar6 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          uVar14 = uVar23 + 4;
        } while (bVar6);
        uVar23 = uVar23 + 1;
      }
LAB_0042e393:
      local_a8._8_8_ = local_90;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 8)
                 ,(ulong)uVar23,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a8._8_8_,local_98,uVar15);
      ptVar2 = (target_fns *)(CONCAT44(uStack_94,local_98) + local_108._8_8_);
      ptVar18 = (target_fns *)0xf;
      if ((object_fns *)local_108._0_8_ != poVar3) {
        ptVar18 = (target_fns *)local_108._16_8_;
      }
      if (ptVar18 < ptVar2) {
        ptVar18 = (target_fns *)0xf;
        if ((target_fns **)local_a8._8_8_ != local_90) {
          ptVar18 = local_90[0];
        }
        if (ptVar18 < ptVar2) goto LAB_0042e410;
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_a8 + 8),0,0,(char *)local_108._0_8_,local_108._8_8_);
      }
      else {
LAB_0042e410:
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_108,(char *)local_a8._8_8_,CONCAT44(uStack_94,local_98));
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar10->_M_dataplus)._M_p;
      paVar13 = &pbVar10->field_2;
      if (paVar5 == paVar13) {
        local_148.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_148.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_148._M_dataplus._M_p = (pointer)paVar5;
      }
      local_148._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar10->_M_string_length = 0;
      paVar13->_M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_148," were connected");
      local_170._0_8_ = (pbVar10->_M_dataplus)._M_p;
      paVar13 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ == paVar13) {
        local_160._0_8_ = paVar13->_M_allocated_capacity;
        local_160._8_8_ = *(uchar (*) [8])((long)&pbVar10->field_2 + 8);
        local_170._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_170 + 0x10);
      }
      else {
        local_160._0_8_ = paVar13->_M_allocated_capacity;
      }
      local_170._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      logger((TcpServer *)local_160._16_8_,1,(string *)local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
      if ((target_fns **)local_a8._8_8_ != local_90) {
        operator_delete((void *)local_a8._8_8_,(ulong)((long)&local_90[0]->target_type + 1));
      }
      if ((object_fns *)local_108._0_8_ != poVar3) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_unused._0_8_ != &local_d8) {
        operator_delete(local_e8._M_unused._M_object,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar11) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      uVar19 = local_c8._M_unused._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_unused._0_8_ == &local_b8) {
        return;
      }
      goto LAB_0042e1c7;
    }
    LOCK();
    (((atomic<bool> *)(local_160._16_8_ + 0xf0))->_M_base)._M_i = true;
    UNLOCK();
    local_170._0_8_ = local_170 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,"halting server operation","");
    logger((TcpServer *)uVar19,1,(string *)local_170);
  }
  else {
    local_170._0_8_ = local_170 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,"previously halted server","");
    logger(this,0,(string *)local_170);
  }
  local_b8._M_allocated_capacity = local_160._0_8_;
  uVar19 = local_170._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_170 + 0x10)) {
    return;
  }
LAB_0042e1c7:
  operator_delete((void *)uVar19,(ulong)(local_b8._M_allocated_capacity + 1));
  return;
}

Assistant:

void TcpServer::initialConnect()
{
    if (halted.load(std::memory_order_acquire)) {
        logger(0, "previously halted server");
        return;
    }
    for (auto& ep : endpoints) {
        auto acc = TcpAcceptor::create(ioctx, ep);
        if (reuse_address) {
            acc->set_option(tcp::acceptor::reuse_address(true));
        } else {
            acc->set_option(tcp::acceptor::reuse_address(false));
        }
        acc->setAcceptCall(
            [this](TcpAcceptor::pointer accPtr, TcpConnection::pointer conn) {
                handle_accept(std::move(accPtr), std::move(conn));
            });
        if (logFunction) {
            acc->setLoggingFunction(logFunction);
        }
        acceptors.push_back(std::move(acc));
    }
    bool anyConnect = false;
    size_t connectedAcceptors = 0;
    int index = 0;
    for (auto& acc : acceptors) {
        ++index;
        if (!acc->connect()) {
            logger(
                0,
                std::string("unable to connect acceptor ") +
                    std::to_string(index) + " of " +
                    std::to_string(acceptors.size()));
            continue;
        }
        ++connectedAcceptors;
        anyConnect = true;
    }
    if (!anyConnect) {
        halted = true;
        logger(1, "halting server operation");
        return;
    }
    if (connectedAcceptors < acceptors.size()) {
        logger(
            1,
            std::string("partial connection on the server ") +
                std::to_string(connectedAcceptors) + " of " +
                std::to_string(acceptors.size()) + " were connected");
    }
}